

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

CHAR_DATA * new_char(void)

{
  int i;
  CHAR_DATA *ch;
  int local_c;
  CHAR_DATA *local_8;
  
  if (char_free == (CHAR_DATA *)0x0) {
    local_8 = (CHAR_DATA *)operator_new(0x340);
  }
  else {
    local_8 = char_free;
    char_free = char_free->next;
  }
  memcpy(local_8,&new_char::ch_zero,0x340);
  local_8->valid = true;
  local_8->name = str_empty;
  local_8->short_descr = str_empty;
  local_8->long_descr = str_empty;
  local_8->description = str_empty;
  local_8->prompt = str_empty;
  local_8->prefix = str_empty;
  local_8->logon = current_time;
  local_8->played = 0;
  local_8->lines = 0x14;
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    local_8->armor[local_c] = 0;
  }
  local_8->position = 8;
  local_8->hit = 0x14;
  local_8->max_hit = 0x14;
  local_8->mana = 100;
  local_8->max_mana = 100;
  local_8->move = 100;
  local_8->max_move = 100;
  local_8->arms = 2;
  local_8->legs = 2;
  local_8->regen_rate = 0;
  local_8->balance = 0;
  local_8->batter = 0;
  local_8->analyze = 0;
  local_8->talismanic = 0.0;
  local_8->law_pass = false;
  zero_vector(local_8->imm_flags);
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    local_8->perm_stat[local_c] = 0xd;
    local_8->mod_stat[local_c] = 0;
  }
  return local_8;
}

Assistant:

CHAR_DATA *new_char(void)
{
	static CHAR_DATA ch_zero;
	CHAR_DATA *ch;
	int i;

	if (char_free == nullptr)
	{
		ch = new CHAR_DATA;

		// if (bDebug)
		// 	RS.Logger.Debug("Char free is null.  . . . . !");
	}
	else
	{
		ch = char_free;
		char_free = char_free->next;
	}

	*ch = ch_zero;

	ch->valid = true;

	ch->name = &str_empty[0];
	ch->short_descr = &str_empty[0];
	ch->long_descr = &str_empty[0];
	ch->description = &str_empty[0];
	ch->prompt = &str_empty[0];
	ch->prefix = &str_empty[0];
	ch->logon = current_time;
	ch->played = 0;
	ch->lines = PAGELEN;

	for (i = 0; i < 4; i++)
	{
		ch->armor[i] = 0;
	}

	ch->position = POS_STANDING;
	ch->hit = 20;
	ch->max_hit = 20;
	ch->mana = 100;
	ch->max_mana = 100;
	ch->move = 100;
	ch->max_move = 100;
	ch->arms = 2;
	ch->legs = 2;
	ch->regen_rate = 0;
	ch->balance = 0;
	ch->batter = 0;
	ch->analyze = 0;
	ch->talismanic = 0;
	ch->law_pass= false;

	zero_vector(ch->imm_flags);

	for (i = 0; i < MAX_STATS; i++)
	{
		ch->perm_stat[i] = 13;
		ch->mod_stat[i] = 0;
	}

	return ch;
}